

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void geopolyJsonFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  GeoPoly *p;
  sqlite3_str *p_00;
  char *z;
  uint uVar2;
  long lVar3;
  
  p = geopolyFuncParam(context,*argv,(int *)0x0);
  if (p != (GeoPoly *)0x0) {
    p_00 = sqlite3_str_new(context->pOut->db);
    uVar1 = p_00->nChar;
    uVar2 = uVar1 + 1;
    if (uVar2 < p_00->nAlloc) {
      p_00->nChar = uVar2;
      p_00->zText[uVar1] = '[';
    }
    else {
      enlargeAndAppend(p_00,"[",1);
    }
    if (0 < p->nVertex) {
      lVar3 = 0;
      do {
        sqlite3_str_appendf(p_00,"[%!g,%!g],",(double)p->a[lVar3 * 2],(double)p->a[lVar3 * 2 + 1]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < p->nVertex);
    }
    sqlite3_str_appendf(p_00,"[%!g,%!g]]",(double)p->a[0],(double)p->a[1]);
    z = sqlite3_str_finish(p_00);
    setResultStrOrError(context,z,-1,'\x01',sqlite3_free);
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

static void geopolyJsonFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyFuncParam(context, argv[0], 0);
  (void)argc;
  if( p ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    sqlite3_str *x = sqlite3_str_new(db);
    int i;
    sqlite3_str_append(x, "[", 1);
    for(i=0; i<p->nVertex; i++){
      sqlite3_str_appendf(x, "[%!g,%!g],", GeoX(p,i), GeoY(p,i));
    }
    sqlite3_str_appendf(x, "[%!g,%!g]]", GeoX(p,0), GeoY(p,0));
    sqlite3_result_text(context, sqlite3_str_finish(x), -1, sqlite3_free);
    sqlite3_free(p);
  }
}